

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilFile.c
# Opt level: O0

int tmpFile(char *prefix,char *suffix,char **out_name)

{
  int __fd;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  int local_24;
  int fd;
  char **out_name_local;
  char *suffix_local;
  char *prefix_local;
  
  sVar1 = strlen(prefix);
  sVar2 = strlen(suffix);
  pcVar3 = (char *)malloc(sVar1 + sVar2 + 7);
  *out_name = pcVar3;
  if (*out_name == (char *)0x0) {
    __assert_fail("*out_name != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilFile.c"
                  ,0x6c,"int tmpFile(const char *, const char *, char **)");
  }
  sprintf(*out_name,"%sXXXXXX",prefix);
  __fd = mkstemp(*out_name);
  if (__fd == -1) {
    free(*out_name);
    *out_name = (char *)0x0;
    local_24 = -1;
  }
  else {
    close(__fd);
    unlink(*out_name);
    strcat(*out_name,suffix);
    local_24 = open(*out_name,0xc2,0x180);
    if (local_24 == -1) {
      free(*out_name);
      *out_name = (char *)0x0;
    }
  }
  return local_24;
}

Assistant:

int tmpFile(const char* prefix, const char* suffix, char** out_name)
{
#if defined(_MSC_VER) || defined(__MINGW32__)
    int i, fd;
    *out_name = (char*)malloc(strlen(prefix) + strlen(suffix) + 27);
    for (i = 0; i < 10; i++){
        sprintf(*out_name, "%s%I64X%d%s", prefix, realTimeAbs(), _getpid(), suffix);
        fd = _open(*out_name, O_CREAT | O_EXCL | O_BINARY | O_RDWR, _S_IREAD | _S_IWRITE);
        if (fd == -1){
            free(*out_name);
            *out_name = NULL;
        }
        return fd;
    }
    assert(0);  // -- could not open temporary file
    return 0;
#else
    int fd;
    *out_name = (char*)malloc(strlen(prefix) + strlen(suffix) + 7);
    assert(*out_name != NULL);
    sprintf(*out_name, "%sXXXXXX", prefix);
    fd = mkstemp(*out_name);
    if (fd == -1){
        free(*out_name);
        *out_name = NULL;
    }else{
        // Kludge:
        close(fd);
        unlink(*out_name);
        strcat(*out_name, suffix);
        fd = open(*out_name, O_CREAT | O_EXCL | O_RDWR, S_IREAD | S_IWRITE);
        if (fd == -1){
            free(*out_name);
            *out_name = NULL;
        }
    }
    return fd;
#endif
}